

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

TextureCubeView *
glu::TextureTestUtil::getSubView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *view,int baseLevel,int maxLevel)

{
  int iVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  CubeFace local_5c;
  int face;
  ConstPixelBufferAccess *levels [6];
  int numLevels;
  int clampedMax;
  int clampedBase;
  int maxLevel_local;
  int baseLevel_local;
  TextureCubeView *view_local;
  
  iVar1 = tcu::TextureCubeView::getNumLevels(view);
  iVar1 = de::clamp<int>(baseLevel,0,iVar1 + -1);
  iVar2 = tcu::TextureCubeView::getNumLevels(view);
  iVar2 = de::clamp<int>(maxLevel,iVar1,iVar2 + -1);
  levels[5]._4_4_ = (iVar2 - iVar1) + 1;
  for (local_5c = CUBEFACE_NEGATIVE_X; (int)local_5c < 6; local_5c = local_5c + CUBEFACE_POSITIVE_X)
  {
    pCVar3 = tcu::TextureCubeView::getFaceLevels(view,local_5c);
    *(ConstPixelBufferAccess **)(&stack0xffffffffffffffa8 + (long)(int)local_5c * 8) =
         pCVar3 + iVar1;
  }
  tcu::TextureCubeView::TextureCubeView
            (__return_storage_ptr__,levels[5]._4_4_,
             (ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

static tcu::TextureCubeView getSubView (const tcu::TextureCubeView& view, int baseLevel, int maxLevel)
{
	const int							clampedBase	= de::clamp(baseLevel, 0, view.getNumLevels()-1);
	const int							clampedMax	= de::clamp(maxLevel, clampedBase, view.getNumLevels()-1);
	const int							numLevels	= clampedMax-clampedBase+1;
	const tcu::ConstPixelBufferAccess*	levels[tcu::CUBEFACE_LAST];

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		levels[face] = view.getFaceLevels((tcu::CubeFace)face) + clampedBase;

	return tcu::TextureCubeView(numLevels, levels);
}